

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O1

uint8_t apx_vm_size_type_to_variant(apx_sizeType_t size_type)

{
  uint8_t uVar1;
  
  uVar1 = 0xff;
  if (size_type < 4) {
    uVar1 = size_type + 0xff;
  }
  return uVar1;
}

Assistant:

uint8_t apx_vm_size_type_to_variant(apx_sizeType_t size_type)
{
   uint8_t variant = APX_VM_VARIANT_INVALID;
   switch (size_type)
   {
   case APX_SIZE_TYPE_UINT8:
      variant = APX_VM_VARIANT_UINT8;
      break;
   case APX_SIZE_TYPE_UINT16:
      variant = APX_VM_VARIANT_UINT16;
      break;
   case APX_SIZE_TYPE_UINT32:
      variant = APX_VM_VARIANT_UINT32;
      break;
   }
   return variant;
}